

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

void column_test_common_z2_content_access<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>>
               (vector<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_>_>
                *matrix)

{
  vector<bool,_std::allocator<bool>_> veccont;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> setcont;
  undefined8 local_78;
  undefined8 uStack_70;
  uint local_68;
  uint local_64;
  vector<bool,_std::allocator<bool>_> local_60;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_38;
  
  local_38._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_38._M_impl.super__Rb_tree_header._M_header;
  local_38._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_38._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_38._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_78 = 0x100000000;
  uStack_70 = 0x500000003;
  local_38._M_impl.super__Rb_tree_header._M_header._M_right =
       local_38._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_assign_unique<unsigned_int_const*>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&local_38,(uint *)&local_78,&local_68);
  local_78 = CONCAT26(local_78._6_2_,0x10001000101);
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_60,&local_78);
  column_test_common_content_access<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>,unsigned_int>
            ((matrix->
             super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_38,
             &local_60);
  local_78 = 0x100000000;
  uStack_70 = 0x500000002;
  local_68 = 6;
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_assign_unique<unsigned_int_const*>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&local_38,(uint *)&local_78,&local_64);
  local_78 = CONCAT17(local_78._7_1_,0x1010000010101);
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_60,&local_78);
  column_test_common_content_access<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>,unsigned_int>
            ((matrix->
             super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 1,
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_38,
             &local_60);
  local_78 = 0x100000000;
  uStack_70 = 0x500000002;
  local_68 = 6;
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_assign_unique<unsigned_int_const*>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&local_38,(uint *)&local_78,&local_64);
  local_78 = CONCAT17(local_78._7_1_,0x1010000010101);
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_60,&local_78);
  column_test_common_content_access<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>,unsigned_int>
            ((matrix->
             super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 2,
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_38,
             &local_60);
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_assign_unique<unsigned_int_const*>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&local_38,(uint *)0x0,(uint *)0x0);
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_60,0,0);
  column_test_common_content_access<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>,unsigned_int>
            ((matrix->
             super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 3,
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_38,
             &local_60);
  local_78 = 0x100000000;
  uStack_70 = 0x500000003;
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_assign_unique<unsigned_int_const*>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&local_38,(uint *)&local_78,&local_68);
  local_78 = CONCAT26(local_78._6_2_,0x10001000101);
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_60,&local_78);
  column_test_common_content_access<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>,unsigned_int>
            ((matrix->
             super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 4,
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_38,
             &local_60);
  local_78 = 0x100000000;
  uStack_70 = 0x500000002;
  local_68 = 6;
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_assign_unique<unsigned_int_const*>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)&local_38,(uint *)&local_78,&local_64);
  local_78 = CONCAT17(local_78._7_1_,0x1010000010101);
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_60,&local_78);
  column_test_common_content_access<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>,unsigned_int>
            ((matrix->
             super__Vector_base<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 5,
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_38,
             &local_60);
  if (local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_38);
  return;
}

Assistant:

void column_test_common_z2_content_access(std::vector<Column>& matrix) {
  std::set<unsigned int> setcont;
  std::vector<typename Column::Field_element> veccont;

  setcont = {0, 1, 3, 5};
  veccont = {1, 1, 0, 1, 0, 1};
  column_test_common_content_access(matrix[0], setcont, veccont);

  setcont = {0, 1, 2, 5, 6};
  veccont = {1, 1, 1, 0, 0, 1, 1};
  column_test_common_content_access(matrix[1], setcont, veccont);

  setcont = {0, 1, 2, 5, 6};
  veccont = {1, 1, 1, 0, 0, 1, 1};
  column_test_common_content_access(matrix[2], setcont, veccont);

  setcont = {};
  veccont = {};
  column_test_common_content_access(matrix[3], setcont, veccont);

  setcont = {0, 1, 3, 5};
  veccont = {1, 1, 0, 1, 0, 1};
  column_test_common_content_access(matrix[4], setcont, veccont);

  setcont = {0, 1, 2, 5, 6};
  veccont = {1, 1, 1, 0, 0, 1, 1};
  column_test_common_content_access(matrix[5], setcont, veccont);
}